

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.h
# Opt level: O3

void heap_insert(heap_t *p,uint entry)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  vec_uint_t *pvVar4;
  sdbl_t *psVar5;
  int *piVar6;
  uint *puVar7;
  char *__function;
  uint uVar8;
  uint uVar9;
  char *__file;
  char *__assertion;
  uint uVar10;
  ulong uVar11;
  vec_int_t *pvVar12;
  
  pvVar12 = p->indices;
  uVar1 = pvVar12->size;
  uVar11 = (ulong)uVar1;
  uVar9 = entry + 1;
  uVar8 = uVar1;
  if (uVar1 < uVar9) {
    pvVar12->size = uVar9;
    if (pvVar12->cap < uVar9) {
      piVar6 = (int *)realloc(pvVar12->data,(ulong)uVar9 << 2);
      pvVar12->data = piVar6;
      if (piVar6 == (int *)0x0) {
        __assert_fail("p->data != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/satoko/utils/vec/vec_int.h"
                      ,0x5e,"void vec_int_resize(vec_int_t *, unsigned int)");
      }
      pvVar12->cap = uVar9;
      pvVar12 = p->indices;
      uVar9 = pvVar12->size;
    }
    uVar8 = uVar9;
    if (uVar1 < uVar9) {
      piVar6 = pvVar12->data;
      do {
        piVar6[uVar11] = -1;
        uVar11 = uVar11 + 1;
        uVar8 = pvVar12->size;
      } while (uVar11 < uVar8);
    }
  }
  if (uVar8 <= entry) goto LAB_00558811;
  if (-1 < pvVar12->data[entry]) {
    __assert_fail("!heap_in_heap(p, entry)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/satoko/utils/heap.h"
                  ,0x7f,"void heap_insert(heap_t *, unsigned int)");
  }
  pvVar4 = p->data;
  uVar9 = pvVar4->size;
  uVar11 = (ulong)uVar9;
  pvVar12->data[entry] = uVar9;
  if (uVar9 == pvVar4->cap) {
    if (uVar9 < 0x10) {
      puVar7 = (uint *)realloc(pvVar4->data,0x40);
      pvVar4->data = puVar7;
      uVar9 = 0x10;
      if (puVar7 == (uint *)0x0) {
LAB_0055888d:
        __assert_fail("p->data != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/satoko/utils/vec/vec_uint.h"
                      ,0x6e,"void vec_uint_reserve(vec_uint_t *, unsigned int)");
      }
    }
    else {
      if ((int)uVar9 < 1) goto LAB_005586f7;
      puVar7 = (uint *)realloc(pvVar4->data,uVar11 * 8);
      pvVar4->data = puVar7;
      if (puVar7 == (uint *)0x0) goto LAB_0055888d;
      uVar9 = uVar9 * 2;
    }
    pvVar4->cap = uVar9;
    uVar11 = (ulong)pvVar4->size;
    pvVar12 = p->indices;
  }
LAB_005586f7:
  pvVar4->data[uVar11] = entry;
  pvVar4->size = pvVar4->size + 1;
  if (pvVar12->size <= entry) {
    __assert_fail("i >= 0 && i < p->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/satoko/utils/vec/vec_int.h"
                  ,0x7e,"int vec_int_at(vec_int_t *, unsigned int)");
  }
  piVar6 = pvVar12->data;
  uVar9 = piVar6[entry];
  uVar11 = (ulong)uVar9;
  pvVar4 = p->data;
  if (pvVar4->size <= uVar9) {
LAB_005587db:
    __assertion = "idx >= 0 && idx < p->size";
    __file = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/satoko/utils/vec/vec_uint.h"
    ;
    __function = "unsigned int vec_uint_at(vec_uint_t *, unsigned int)";
LAB_00558807:
    __assert_fail(__assertion,__file,0x85,__function);
  }
  puVar7 = pvVar4->data;
  uVar1 = puVar7[uVar11];
  if (uVar9 != 0) {
    do {
      uVar8 = (uint)uVar11;
      uVar10 = uVar8 - 1 >> 1;
      uVar9 = pvVar4->size;
      if (uVar9 <= uVar10) goto LAB_005587db;
      uVar2 = p->weights->size;
      if (uVar2 <= uVar1) {
LAB_005587f2:
        __assertion = "i >= 0 && i < p->size";
        __file = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/satoko/utils/vec/vec_sdbl.h"
        ;
        __function = "sdbl_t vec_sdbl_at(vec_sdbl_t *, unsigned int)";
        goto LAB_00558807;
      }
      uVar3 = puVar7[uVar10];
      if (uVar2 <= uVar3) goto LAB_005587f2;
      psVar5 = p->weights->data;
      if (psVar5[uVar1] <= psVar5[uVar3]) {
        if (uVar9 <= uVar8) goto LAB_00558830;
        puVar7[uVar11] = uVar1;
        if (pvVar12->size <= uVar1) goto LAB_00558811;
        goto LAB_005587c9;
      }
      if (uVar9 <= uVar8) goto LAB_00558830;
      puVar7[uVar11] = uVar3;
      if (pvVar4->size <= uVar10) goto LAB_005587db;
      if (pvVar12->size <= puVar7[uVar10]) goto LAB_00558811;
      piVar6[puVar7[uVar10]] = uVar8;
      uVar11 = (ulong)uVar10;
    } while (1 < uVar8 - 1);
    if (pvVar4->size == 0) {
LAB_00558830:
      __assert_fail("(idx >= 0) && (idx < vec_uint_size(p))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/satoko/utils/vec/vec_uint.h"
                    ,0xc2,"void vec_uint_assign(vec_uint_t *, unsigned int, unsigned int)");
    }
  }
  *puVar7 = uVar1;
  if (uVar1 < pvVar12->size) {
    uVar8 = 0;
LAB_005587c9:
    piVar6[uVar1] = uVar8;
    return;
  }
LAB_00558811:
  __assert_fail("(i >= 0) && (i < vec_int_size(p))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/satoko/utils/vec/vec_int.h"
                ,0xa6,"void vec_int_assign(vec_int_t *, unsigned int, int)");
}

Assistant:

static inline void heap_insert(heap_t *p, unsigned entry)
{
    if (vec_int_size(p->indices) < entry + 1) {
        unsigned old_size = vec_int_size(p->indices);
        unsigned i;
        int e;
        vec_int_resize(p->indices, entry + 1);
        vec_int_foreach_start(p->indices, e, i, old_size)
            vec_int_assign(p->indices, i, -1);
    }
    assert(!heap_in_heap(p, entry));
    vec_int_assign(p->indices, entry, (int) vec_uint_size(p->data));
    vec_uint_push_back(p->data, entry);
    heap_percolate_up(p, (unsigned) vec_int_at(p->indices, entry));
}